

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O2

void __thiscall
Inferences::VariablePowerGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  FlatMeetLattice<int> current;
  Option<Kernel::Variable> var;
  StlIter __begin2;
  StlIter __begin3;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_c0;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> factor;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> summand;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_50;
  
  local_50._iter._func.a = &p->_ptr->_summands;
  local_50._iter._inner._to =
       ((long)(local_50._iter._func.a)->_cursor - (long)(local_50._iter._func.a)->_stack) / 0x30;
  local_50._iter._inner._next = 0;
  local_50._iter._inner._from = 0;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::StlIter::StlIter(&__begin2,&local_50);
  while ((OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>)
         __begin2._cur.
         super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>.
         super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>.
         _elem != (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                   )0x0) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
              (&summand,(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                        __begin2._cur.
                        super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>
                        .
                        super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                        ._elem);
    local_c0._iter._inner._to =
         ((long)((summand.factors._ptr)->_factors)._cursor -
         (long)((summand.factors._ptr)->_factors)._stack) / 0x1c;
    local_c0._iter._inner._next = 0;
    local_c0._iter._inner._from = 0;
    local_c0._iter._func.a =
         (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)summand.factors._ptr
    ;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::StlIter(&__begin3,&local_c0);
    while ((OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
            )__begin3._cur.
             super_OptionBase<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>
             .
             super_OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
             ._elem !=
           (OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
            )0x0) {
      Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactor
                (&factor,(MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                         __begin3._cur.
                         super_OptionBase<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>
                         .
                         super_OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
                         ._elem);
      Kernel::PolyNf::tryVar(&factor.term);
      if (var.super_OptionBase<Kernel::Variable>._isSome) {
        if ((uint)factor.power < 2) {
          current._inner._inner = (Inner)(RawWithDefaultImpls<int,_Inferences::Bot>)0xff;
        }
        else {
          current._inner._inner =
               (Inner)((ulong)CONCAT34(current._inner._inner._5_3_,factor.power) << 8);
        }
        Lib::Map<Kernel::Variable,Inferences::FlatMeetLattice<int>,Lib::StlHash>::operator()
                  ((Map<Kernel::Variable,Inferences::FlatMeetLattice<int>,Lib::StlHash> *)
                   this->powers,(Variable)var.super_OptionBase<Kernel::Variable>._elem._elem,
                   &current,&current);
      }
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
      ::StlIter::operator++(&__begin3);
    }
    Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&summand);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator++(&__begin2);
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<RealTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {
      for (auto factor : summand.factors->iter()) {
        auto var = factor.term.tryVar();
        if (var.isSome()) {


          auto current = factor.power == 0 || factor.power == 1  /* <- power 0 should never happen. 
                                                                       power 1 yields a nop-generalization */
            ? IntLattice::bot()
            : IntLattice(factor.power);

          powers.updateOrInit(var.unwrap(),
              [&](IntLattice old) { return current.meet(old); },
              [&]() { return current; }
            );
        }
      }
    }
  }